

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O1

void __thiscall QSslCipher::QSslCipher(QSslCipher *this,QString *name)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  _Head_base<0UL,_QSslCipherPrivate_*,_false> _Var6;
  QList<QSslCipher> *__range1;
  long lVar7;
  QSslCipher *other;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QArrayDataPointer<QSslCipher> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var6._M_head_impl = (QSslCipherPrivate *)operator_new(0x98);
  (_Var6._M_head_impl)->isNull = true;
  ((_Var6._M_head_impl)->protocolString).d.d = 0;
  *(char16_t **)((long)&(_Var6._M_head_impl)->protocolString + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var6._M_head_impl)->protocolString + 0x10) = 0;
  ((_Var6._M_head_impl)->name).d.d = 0;
  *(char16_t **)((long)&(_Var6._M_head_impl)->name + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var6._M_head_impl)->name + 0x10) = 0;
  (_Var6._M_head_impl)->supportedBits = 0;
  (_Var6._M_head_impl)->bits = 0;
  ((_Var6._M_head_impl)->keyExchangeMethod).d.d = 0;
  *(char16_t **)((long)&(_Var6._M_head_impl)->keyExchangeMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var6._M_head_impl)->keyExchangeMethod + 0x10) = 0;
  ((_Var6._M_head_impl)->authenticationMethod).d.d = 0;
  *(char16_t **)((long)&(_Var6._M_head_impl)->authenticationMethod + 8) = (char16_t *)0x0;
  *(qsizetype *)((long)&(_Var6._M_head_impl)->authenticationMethod + 0x10) = 0;
  ((_Var6._M_head_impl)->encryptionMethod).d.d = 0;
  *(char16_t **)((long)&(_Var6._M_head_impl)->encryptionMethod + 8) = (char16_t *)0x0;
  *(undefined8 *)((long)&(_Var6._M_head_impl)->encryptionMethod + 9) = 0;
  *(undefined8 *)((long)&(_Var6._M_head_impl)->encryptionMethod + 0x11) = 0;
  (_Var6._M_head_impl)->protocol = UnknownProtocol;
  (this->d)._M_t.super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
  super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl = _Var6._M_head_impl;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QSslCipher *)&DAT_aaaaaaaaaaaaaaaa;
  QSslConfiguration::supportedCiphers();
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lVar7 = local_58.size << 3;
    other = local_58.ptr;
    do {
      _Var6._M_head_impl =
           (other->d)._M_t.
           super___uniq_ptr_impl<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QSslCipherPrivate_*,_std::default_delete<QSslCipherPrivate>_>.
           super__Head_base<0UL,_QSslCipherPrivate_*,_false>._M_head_impl;
      pQVar1 = *(QArrayData **)&((_Var6._M_head_impl)->name).d;
      pcVar2 = *(char16_t **)((long)&(_Var6._M_head_impl)->name + 8);
      lVar3 = *(qsizetype *)((long)&(_Var6._M_head_impl)->name + 0x10);
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar4 = (name->d).size;
      if (lVar3 == lVar4) {
        QVar8.m_data = pcVar2;
        QVar8.m_size = lVar3;
        QVar9.m_data = (name->d).ptr;
        QVar9.m_size = lVar4;
        cVar5 = QtPrivate::equalStrings(QVar8,QVar9);
      }
      else {
        cVar5 = '\0';
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      if (cVar5 != '\0') {
        operator=(this,other);
        break;
      }
      other = other + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  QArrayDataPointer<QSslCipher>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QSslCipher::QSslCipher(const QString &name)
    : d(new QSslCipherPrivate)
{
    const auto ciphers = QSslConfiguration::supportedCiphers();
    for (const QSslCipher &cipher : ciphers) {
        if (cipher.name() == name) {
            *this = cipher;
            return;
        }
    }
}